

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::safe_strtod(char *str,double *value)

{
  byte *pbVar1;
  bool bVar2;
  double dVar3;
  char *endptr;
  byte *local_20;
  
  dVar3 = io::NoLocaleStrtod(str,(char **)&local_20);
  *value = dVar3;
  pbVar1 = local_20;
  if (local_20 != (byte *)str) {
    do {
      do {
        local_20 = pbVar1;
        pbVar1 = local_20 + 1;
      } while (*local_20 - 9 < 5);
    } while (*local_20 == 0x20);
  }
  if (*str == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = *local_20 == 0;
  }
  return bVar2;
}

Assistant:

bool safe_strtod(const char* str, double* value) {
  char* endptr;
  *value = io::NoLocaleStrtod(str, &endptr);
  if (endptr != str) {
    while (ascii_isspace(*endptr)) ++endptr;
  }
  // Ignore range errors from strtod.  The values it
  // returns on underflow and overflow are the right
  // fallback in a robust setting.
  return *str != '\0' && *endptr == '\0';
}